

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::removeMask(Image *this)

{
  int32 iVar1;
  int local_30;
  int local_2c;
  int32 x;
  int32 y;
  uint8 *p;
  uint8 *line;
  int32 i;
  int32 pallen;
  Image *this_local;
  
  if (this->depth < 9) {
    iVar1 = this->depth;
    for (line._0_4_ = 0; (int)line < (1 << ((byte)iVar1 & 0x1f)) << 2; line._0_4_ = (int)line + 4) {
      this->palette[(int)line + 3] = 0xff;
    }
  }
  else if (this->depth != 0x18) {
    p = this->pixels;
    for (local_2c = 0; local_2c < this->height; local_2c = local_2c + 1) {
      _x = p;
      for (local_30 = 0; local_30 < this->width; local_30 = local_30 + 1) {
        if (this->depth == 0x10) {
          _x[1] = _x[1] | 0x80;
          _x = _x + 2;
        }
        else if (this->depth == 0x20) {
          _x[3] = 0xff;
          _x = _x + 4;
        }
      }
      p = p + this->stride;
    }
  }
  return;
}

Assistant:

void
Image::removeMask(void)
{
	if(this->depth <= 8){
		assert(this->palette);
		int32 pallen = 4*(1 << this->depth);
		for(int32 i = 0; i < pallen; i += 4)
			this->palette[i+3] = 0xFF;
		return;
	}
	if(this->depth == 24)
		return;
	assert(this->pixels);
	uint8 *line = this->pixels;
	uint8 *p;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 16:
				p[1] |= 0x80;
				p += 2;
				break;
			case 32:
				p[3] = 0xFF;
				p += 4;
				break;
			}
		}
		line += this->stride;
	}
}